

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O3

void __thiscall
cs::translator_type::translate
          (translator_type *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *lines,deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *statements,
          bool raw)

{
  method_base **ppmVar1;
  element_type *peVar2;
  stack_pointer psVar3;
  method_base **ppmVar4;
  int iVar5;
  method_base *pmVar6;
  domain_type *domain_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  error *peVar7;
  compile_error *pcVar8;
  _Elt_pointer pptVar9;
  method_base *pmVar10;
  deque<cs::statement_base*,std::allocator<cs::statement_base*>> *this_00;
  stack_pointer this_01;
  _Elt_pointer __x;
  domain_type domain;
  stack_type<cs::method_base_*,_std::allocator> methods;
  statement_base *sptr;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> line;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  tmp;
  undefined1 local_258 [32];
  undefined8 local_238;
  CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  CStack_230;
  element_type *local_228;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_220;
  pointer local_218;
  pointer paStack_210;
  stack_type<cs::method_base_*,_std::allocator> local_1f8;
  size_t local_1c8;
  context_t *local_1c0;
  deque<cs::statement_base*,std::allocator<cs::statement_base*>> *local_1b8;
  statement_base *local_1b0;
  _Map_pointer local_1a8;
  _Elt_pointer local_1a0;
  undefined1 local_198 [80];
  _Elt_pointer local_148;
  translator_type *local_140;
  _Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> local_f8;
  _Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  local_88;
  
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_1b8 = (deque<cs::statement_base*,std::allocator<cs::statement_base*>> *)statements;
  local_140 = this;
  std::
  _Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::_M_initialize_map(&local_88,0);
  local_1f8.m_start = (method_base **)0x0;
  local_1f8.m_current = (method_base **)0x0;
  local_1f8.m_data = (aligned_type *)0x0;
  local_1f8.m_size = 0;
  stack_type<cs::method_base_*,_std::allocator>::resize(&local_1f8,0x200);
  __x = (lines->
        super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
        )._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_148 = (lines->
              super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
              )._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (__x != local_148) {
    local_1a0 = (lines->
                super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                )._M_impl.super__Deque_impl_data._M_start._M_last;
    local_1a8 = (lines->
                super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                )._M_impl.super__Deque_impl_data._M_start._M_node;
    local_1c8 = 0;
    local_1c0 = context;
    do {
      std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
                ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_f8,__x);
      if (raw) {
        compiler_type::process_line
                  ((((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr)->compiler).
                   super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_f8);
      }
      pmVar6 = match(local_140,
                     (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_f8);
      iVar5 = (*pmVar6->_vptr_method_base[2])(pmVar6);
      ppmVar4 = local_1f8.m_current;
      ppmVar1 = local_1f8.m_start;
      switch(iVar5) {
      case 0:
        pcVar8 = (compile_error *)__cxa_allocate_exception(0x28);
        local_258._0_8_ = local_258 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_258,"Null type of grammar.","");
        compile_error::compile_error(pcVar8,(string *)local_258);
        __cxa_throw(pcVar8,&compile_error::typeinfo,compile_error::~compile_error);
      case 1:
        local_1b0 = (statement_base *)0x0;
        iVar5 = (*pmVar6->_vptr_method_base[3])(pmVar6);
        this_00 = local_1b8;
        context = local_1c0;
        if (ppmVar4 == ppmVar1) {
          if (iVar5 == 0x19) {
            pcVar8 = (compile_error *)__cxa_allocate_exception(0x28);
            local_258._0_8_ = local_258 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_258,"Hanging end statement.","");
            compile_error::compile_error(pcVar8,(string *)local_258);
            __cxa_throw(pcVar8,&compile_error::typeinfo,compile_error::~compile_error);
          }
          if (raw) {
            std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
                      ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)local_198,
                       (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_f8);
            local_218 = (pointer)0x0;
            paStack_210 = (pointer)0x0;
            local_228 = (element_type *)0x0;
            _Stack_220._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_238 = 0;
            CStack_230.
            super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
            .
            super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_0UL,_false>
            .value = (CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
                      )(Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_0UL,_false>
                        )0x0;
            local_258._16_8_ = 0;
            local_258._24_8_ = 0;
            local_258._0_8_ = (ctrl_t *)0x0;
            local_258._8_8_ = (slot_type *)0x0;
            std::
            deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
            ::_M_range_initialize<std::deque<cs::token_base*,std::allocator<cs::token_base*>>const*>
                      ((deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
                        *)local_258,
                       (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)local_198,
                       &local_148);
            (*pmVar6->_vptr_method_base[4])
                      (pmVar6,context,
                       (deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
                        *)local_258);
            std::
            deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
            ::~deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                      *)local_258);
            std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base
                      ((_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)local_198
                      );
          }
          std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
                    ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)local_198,
                     (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_f8);
          local_218 = (pointer)0x0;
          paStack_210 = (pointer)0x0;
          local_228 = (element_type *)0x0;
          _Stack_220._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_238 = 0;
          CStack_230.
          super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
          .
          super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_0UL,_false>
          .value = (CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
                    )(Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_0UL,_false>
                      )0x0;
          local_258._16_8_ = 0;
          local_258._24_8_ = 0;
          local_258._0_8_ = (ctrl_t *)0x0;
          local_258._8_8_ = (slot_type *)0x0;
          std::
          deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
          ::_M_range_initialize<std::deque<cs::token_base*,std::allocator<cs::token_base*>>const*>
                    ((deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
                      *)local_258,
                     (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)local_198,
                     &local_148);
          iVar5 = (*pmVar6->_vptr_method_base[5])
                            (pmVar6,context,
                             (deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
                              *)local_258);
          local_1b0 = (statement_base *)CONCAT44(extraout_var,iVar5);
          std::
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          ::~deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                    *)local_258);
          std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base
                    ((_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)local_198);
        }
        else {
          if (iVar5 == 0x19) {
            if (raw) {
              stack_type<phmap::flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator>
              ::pop_no_return(&(((((local_1c0->
                                   super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)
                                  ._M_ptr)->instance).
                                 super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)->super_runtime_type).storage.m_set);
              domain_00 = domain_manager::get_domain
                                    (&(((((context->
                                          super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>
                                          )._M_ptr)->instance).
                                        super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->super_runtime_type).storage);
              domain_type::domain_type((domain_type *)local_258,domain_00);
              domain_manager::remove_domain
                        (&(((((context->
                              super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr)->instance).
                            super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                           )->super_runtime_type).storage);
              if (local_1f8.m_current == local_1f8.m_start) {
                peVar7 = (error *)__cxa_allocate_exception(0x28);
                local_198._0_8_ = local_198 + 0x10;
                local_198._16_4_ = 0x30303045;
                local_198._20_2_ = 0x48;
                local_198._8_8_ = 5;
                cov::error::error(peVar7,(string *)local_198);
                __cxa_throw(peVar7,&cov::error::typeinfo,cov::error::~error);
              }
              (*local_1f8.m_current[-1]->_vptr_method_base[6])
                        (local_1f8.m_current[-1],context,(domain_type *)local_258);
              domain_type::~domain_type((domain_type *)local_258);
            }
            if (local_1f8.m_current == local_1f8.m_start) {
              peVar7 = (error *)__cxa_allocate_exception(0x28);
              local_258._0_8_ = local_258 + 0x10;
              local_258._16_6_ = 0x4830303045;
              local_258._8_8_ = (slot_type *)0x5;
              cov::error::error(peVar7,(string *)local_258);
              __cxa_throw(peVar7,&cov::error::typeinfo,cov::error::~error);
            }
            pmVar10 = local_1f8.m_current[-1];
            local_1f8.m_current = local_1f8.m_current + -1;
          }
          else {
            pmVar10 = (method_base *)0x0;
          }
          this_00 = local_1b8;
          if (local_1f8.m_current == local_1f8.m_start) {
            iVar5 = (*pmVar6->_vptr_method_base[3])(pmVar6);
            if (iVar5 == 0x19) {
              iVar5 = (*pmVar6->_vptr_method_base[7])(pmVar6,pmVar10,context,&local_88,&local_f8);
              local_1b0 = (statement_base *)CONCAT44(extraout_var_00,iVar5);
            }
            else {
              iVar5 = (*pmVar10->_vptr_method_base[5])(pmVar10,context,&local_88);
              local_1b0 = (statement_base *)CONCAT44(extraout_var_01,iVar5);
            }
            this_00 = local_1b8;
            std::
            deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
            ::clear((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                     *)&local_88);
          }
          else {
            if (raw) {
              std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
                        ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)local_198,
                         (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_f8);
              local_218 = (pointer)0x0;
              paStack_210 = (pointer)0x0;
              local_228 = (element_type *)0x0;
              _Stack_220._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_238 = 0;
              CStack_230.
              super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
              .
              super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_0UL,_false>
              .value = (CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
                        )(Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_0UL,_false>
                          )0x0;
              local_258._16_8_ = 0;
              local_258._24_8_ = 0;
              local_258._0_8_ = (ctrl_t *)0x0;
              local_258._8_8_ = (slot_type *)0x0;
              std::
              deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
              ::
              _M_range_initialize<std::deque<cs::token_base*,std::allocator<cs::token_base*>>const*>
                        ((deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
                          *)local_258,
                         (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)local_198,
                         &local_148);
              (*pmVar6->_vptr_method_base[4])
                        (pmVar6,context,
                         (deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
                          *)local_258);
              std::
              deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
              ::~deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                        *)local_258);
              std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base
                        ((_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                         local_198);
            }
            std::
            deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
            ::push_back((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                         *)&local_88,(value_type *)&local_f8);
          }
        }
        if (local_1b0 != (statement_base *)0x0) {
          if (*(long **)(this_00 + 0x30) == (long *)(*(long *)(this_00 + 0x40) + -8)) {
            std::deque<cs::statement_base*,std::allocator<cs::statement_base*>>::
            _M_push_back_aux<cs::statement_base*const&>(this_00,&local_1b0);
          }
          else {
            **(long **)(this_00 + 0x30) = (long)local_1b0;
            *(long *)(this_00 + 0x30) = *(long *)(this_00 + 0x30) + 8;
          }
        }
        break;
      case 2:
        if ((long)local_1f8.m_current - (long)local_1f8.m_start == 0) {
          pptVar9 = local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_f8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            pptVar9 = local_f8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
          }
          local_1c8 = pptVar9[-1]->line_num;
        }
        if ((long)local_1f8.m_current - (long)local_1f8.m_start >> 3 == local_1f8.m_size) {
          peVar7 = (error *)__cxa_allocate_exception(0x28);
          local_258._0_8_ = local_258 + 0x10;
          local_258._16_6_ = 0x4930303045;
          local_258._8_8_ = (slot_type *)0x5;
          cov::error::error(peVar7,(string *)local_258);
          __cxa_throw(peVar7,&cov::error::typeinfo,cov::error::~error);
        }
        ppmVar1 = local_1f8.m_current + 1;
        *local_1f8.m_current = pmVar6;
        local_1f8.m_current = ppmVar1;
        if (raw) {
          peVar2 = (((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr)->instance).
                   super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          psVar3 = *(peVar2->super_runtime_type).storage.fiber_stack;
          this_01 = &(peVar2->super_runtime_type).storage.m_data;
          if (psVar3 != (stack_pointer)0x0) {
            this_01 = psVar3;
          }
          stack_type<cs::domain_type,_std::allocator>::push<>(this_01);
          domain_manager::add_set
                    (&(((((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr)->instance).
                        super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      super_runtime_type).storage);
          if (local_1f8.m_current == local_1f8.m_start) {
            peVar7 = (error *)__cxa_allocate_exception(0x28);
            local_258._0_8_ = local_258 + 0x10;
            local_258._16_6_ = 0x4830303045;
            local_258._8_8_ = (slot_type *)0x5;
            cov::error::error(peVar7,(string *)local_258);
            __cxa_throw(peVar7,&cov::error::typeinfo,cov::error::~error);
          }
          pmVar6 = local_1f8.m_current[-1];
          std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
                    ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)local_198,
                     (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_f8);
          local_218 = (pointer)0x0;
          paStack_210 = (pointer)0x0;
          local_228 = (element_type *)0x0;
          _Stack_220._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_238 = 0;
          CStack_230.
          super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
          .
          super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_0UL,_false>
          .value = (CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
                    )(Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_0UL,_false>
                      )0x0;
          local_258._16_8_ = 0;
          local_258._24_8_ = 0;
          local_258._0_8_ = (ctrl_t *)0x0;
          local_258._8_8_ = (slot_type *)0x0;
          std::
          deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
          ::_M_range_initialize<std::deque<cs::token_base*,std::allocator<cs::token_base*>>const*>
                    ((deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
                      *)local_258,
                     (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)local_198,
                     &local_148);
          (*pmVar6->_vptr_method_base[4])
                    (pmVar6,context,
                     (deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
                      *)local_258);
          std::
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          ::~deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                    *)local_258);
          std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base
                    ((_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)local_198);
        }
        std::
        deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
        ::push_back((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                     *)&local_88,(value_type *)&local_f8);
        break;
      case 3:
        std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
                  ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)local_198,
                   (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_f8);
        local_218 = (pointer)0x0;
        paStack_210 = (pointer)0x0;
        local_228 = (element_type *)0x0;
        _Stack_220._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_238 = 0;
        CStack_230.
        super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
        .
        super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_0UL,_false>
        .value = (CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
                  )(Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_0UL,_false>
                    )0x0;
        local_258._16_8_ = 0;
        local_258._24_8_ = 0;
        local_258._0_8_ = (ctrl_t *)0x0;
        local_258._8_8_ = (slot_type *)0x0;
        std::
        deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
        ::_M_range_initialize<std::deque<cs::token_base*,std::allocator<cs::token_base*>>const*>
                  ((deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
                    *)local_258,
                   (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)local_198,
                   &local_148);
        (*pmVar6->_vptr_method_base[5])
                  (pmVar6,context,
                   (deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
                    *)local_258);
        std::
        deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
        ::~deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                  *)local_258);
        std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base
                  ((_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)local_198);
      }
      std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base(&local_f8)
      ;
      __x = __x + 1;
      if (__x == local_1a0) {
        __x = local_1a8[1];
        local_1a8 = local_1a8 + 1;
        local_1a0 = __x + 6;
      }
    } while (__x != local_148);
  }
  if (local_1f8.m_current != local_1f8.m_start) {
    pcVar8 = (compile_error *)__cxa_allocate_exception(0x28);
    local_258._0_8_ = local_258 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_258,"Lack of the \"end\" signal.","");
    compile_error::compile_error(pcVar8,(string *)local_258);
    __cxa_throw(pcVar8,&compile_error::typeinfo,compile_error::~compile_error);
  }
  operator_delete(local_1f8.m_data,local_1f8.m_size << 3);
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::~deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
            *)&local_88);
  return;
}

Assistant:

void translator_type::translate(const context_t &context, const std::deque<std::deque<token_base *>> &lines,
	                                std::deque<statement_base *> &statements, bool raw)
	{
		std::size_t method_line_num = 0, line_num = 0;
		std::deque<std::deque<token_base *>> tmp;
		stack_type<method_base *> methods;
		for (auto &it: lines) {
			std::deque<token_base *> line = it;
			line_num = static_cast<token_endline *>(line.back())->get_line_num();
			try {
				if (raw)
					context->compiler->process_line(line);
				method_base *m = this->match(line);
				switch (m->get_type()) {
				case method_types::null:
					throw compile_error("Null type of grammar.");
					break;
				case method_types::single: {
					statement_base *sptr = nullptr;
					if (!methods.empty()) {
						method_base *expected_method = nullptr;
						if (m->get_target_type() == statement_types::end_) {
							if (raw) {
								context->instance->storage.remove_set();
								domain_type domain = std::move(context->instance->storage.get_domain());
								context->instance->storage.remove_domain();
								methods.top()->postprocess(context, domain);
							}
							expected_method = methods.top();
							methods.pop();
						}
						if (methods.empty()) {
							line_num = method_line_num;
							if (m->get_target_type() == statement_types::end_)
								sptr = static_cast<method_end *>(m)->translate_end(expected_method, context, tmp,
								        line);
							else
								sptr = expected_method->translate(context, tmp);
							tmp.clear();
						}
						else {
							if (raw)
								m->preprocess(context, {line});
							tmp.push_back(line);
						}
					}
					else {
						if (m->get_target_type() == statement_types::end_)
							throw compile_error("Hanging end statement.");
						else {
							if (raw)
								m->preprocess(context, {line});
							sptr = m->translate(context, {line});
						}
					}
					if (sptr != nullptr)
						statements.push_back(sptr);
				}
				break;
				case method_types::block: {
					if (methods.empty())
						method_line_num = static_cast<token_endline *>(line.back())->get_line_num();
					methods.push(m);
					if (raw) {
						context->instance->storage.add_domain();
						context->instance->storage.add_set();
						methods.top()->preprocess(context, {line});
					}
					tmp.push_back(line);
				}
				break;
				case method_types::jit_command:
					m->translate(context, {line});
					break;
				}
			}
			catch (const cs::exception &e) {
				throw e;
			}
			catch (const std::exception &e) {
				throw exception(line_num, context->file_path, context->file_buff.at(line_num - 1), e.what());
			}
		}
		if (!methods.empty())
			throw compile_error("Lack of the \"end\" signal.");
	}